

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O1

void __thiscall
icu_63::LocaleDisplayNamesImpl::CapitalizationContextSink::put
          (CapitalizationContextSink *this,char *key,ResourceValue *value,UBool param_3,
          UErrorCode *errorCode)

{
  bool bVar1;
  char *__s1;
  UBool UVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  int i;
  long lVar4;
  int32_t len;
  ResourceTable contexts;
  int local_6c;
  char *local_68;
  CapitalizationContextSink *local_60;
  ResourceTable local_58;
  
  local_68 = key;
  local_60 = this;
  (*(value->super_UObject)._vptr_UObject[0xb])
            (&local_58,value,errorCode,CONCAT71(in_register_00000009,param_3));
  if ((*errorCode < U_ILLEGAL_ARGUMENT_ERROR) &&
     (UVar2 = ResourceTable::getKeyAndValue(&local_58,0,&local_68,value), UVar2 != '\0')) {
    i = 1;
    do {
      __s1 = local_68;
      iVar3 = strcmp(local_68,"key");
      if (iVar3 == 0) {
        lVar4 = 4;
LAB_002851e1:
        local_6c = 0;
        iVar3 = (*(value->super_UObject)._vptr_UObject[8])(value,&local_6c,errorCode);
        bVar1 = true;
        if (((*errorCode < U_ILLEGAL_ARGUMENT_ERROR) && (bVar1 = false, 1 < local_6c)) &&
           (*(int *)(CONCAT44(extraout_var,iVar3) +
                    (ulong)(local_60->parent->capitalizationContext !=
                           UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU) * 4) != 0)) {
          local_60->parent->fCapitalization[lVar4] = '\x01';
          local_60->hasCapitalizationUsage = '\x01';
          bVar1 = false;
        }
      }
      else {
        iVar3 = strcmp(__s1,"keyValue");
        if (iVar3 == 0) {
          lVar4 = 5;
          goto LAB_002851e1;
        }
        iVar3 = strcmp(__s1,"languages");
        if (iVar3 == 0) {
          lVar4 = 0;
          goto LAB_002851e1;
        }
        iVar3 = strcmp(__s1,"script");
        if (iVar3 == 0) {
          lVar4 = 1;
          goto LAB_002851e1;
        }
        iVar3 = strcmp(__s1,"territory");
        if (iVar3 == 0) {
          lVar4 = 2;
          goto LAB_002851e1;
        }
        iVar3 = strcmp(__s1,"variant");
        bVar1 = false;
        if (iVar3 == 0) {
          lVar4 = 3;
          goto LAB_002851e1;
        }
      }
      if (bVar1) {
        return;
      }
      UVar2 = ResourceTable::getKeyAndValue(&local_58,i,&local_68,value);
      i = i + 1;
    } while (UVar2 != '\0');
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value, UBool /*noFallback*/,
            UErrorCode &errorCode) {
        ResourceTable contexts = value.getTable(errorCode);
        if (U_FAILURE(errorCode)) { return; }
        for (int i = 0; contexts.getKeyAndValue(i, key, value); ++i) {

            CapContextUsage usageEnum;
            if (uprv_strcmp(key, "key") == 0) {
                usageEnum = kCapContextUsageKey;
            } else if (uprv_strcmp(key, "keyValue") == 0) {
                usageEnum = kCapContextUsageKeyValue;
            } else if (uprv_strcmp(key, "languages") == 0) {
                usageEnum = kCapContextUsageLanguage;
            } else if (uprv_strcmp(key, "script") == 0) {
                usageEnum = kCapContextUsageScript;
            } else if (uprv_strcmp(key, "territory") == 0) {
                usageEnum = kCapContextUsageTerritory;
            } else if (uprv_strcmp(key, "variant") == 0) {
                usageEnum = kCapContextUsageVariant;
            } else {
                continue;
            }

            int32_t len = 0;
            const int32_t* intVector = value.getIntVector(len, errorCode);
            if (U_FAILURE(errorCode)) { return; }
            if (len < 2) { continue; }

            int32_t titlecaseInt = (parent.capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU) ? intVector[0] : intVector[1];
            if (titlecaseInt == 0) { continue; }

            parent.fCapitalization[usageEnum] = TRUE;
            hasCapitalizationUsage = TRUE;
        }
    }